

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::~CVmImageLoader(CVmImageLoader *this)

{
  CVmRuntimeSymbols *pCVar1;
  CVmHashTable *pCVar2;
  CVmStaticInitPage *pCVar3;
  CVmStaticInitPage *pCVar4;
  long lVar5;
  
  for (lVar5 = 8; lVar5 != 10; lVar5 = lVar5 + 1) {
    if (*(long **)(this->timestamp_ + lVar5 * 8 + -0x24) != (long *)0x0) {
      (**(code **)(**(long **)(this->timestamp_ + lVar5 * 8 + -0x24) + 8))();
    }
  }
  lib_free_str(this->fname_);
  lib_free_str(this->path_);
  pCVar1 = this->runtime_symtab_;
  if (pCVar1 != (CVmRuntimeSymbols *)0x0) {
    CVmRuntimeSymbols::~CVmRuntimeSymbols(pCVar1);
    operator_delete(pCVar1,0x18);
  }
  pCVar1 = this->runtime_macros_;
  if (pCVar1 != (CVmRuntimeSymbols *)0x0) {
    CVmRuntimeSymbols::~CVmRuntimeSymbols(pCVar1);
    operator_delete(pCVar1,0x18);
  }
  pCVar2 = this->exports_;
  if (pCVar2 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(pCVar2);
  }
  operator_delete(pCVar2,0x20);
  pCVar2 = this->synth_exports_;
  if (pCVar2 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(pCVar2);
  }
  operator_delete(pCVar2,0x20);
  pCVar4 = this->static_head_;
  while (pCVar4 != (CVmStaticInitPage *)0x0) {
    pCVar3 = pCVar4->nxt_;
    (*this->fp_->_vptr_CVmImageFile[6])(this->fp_,pCVar4->data_);
    operator_delete(this->static_head_,0x18);
    this->static_head_ = pCVar3;
    pCVar4 = pCVar3;
  }
  return;
}

Assistant:

CVmImageLoader::~CVmImageLoader()
{
    size_t i;

    /* delete the pool tracking objects */
    for (i = 0 ; i < sizeof(pools_)/sizeof(pools_[0]) ; ++i)
        delete pools_[i];

    /* delete the filename string and path */
    lib_free_str(fname_);
    lib_free_str(path_);

    /* if we have our own runtime symbol/macro tables, delete them */
    if (runtime_symtab_ != 0)
        delete runtime_symtab_;
    if (runtime_macros_ != 0)
        delete runtime_macros_;

    /* delete the exports tables */
    delete exports_;
    delete synth_exports_;

    /* delete the static initializer pages */
    while (static_head_ != 0)
    {
        CVmStaticInitPage *nxt;
        
        /* remember the next one */
        nxt = static_head_->nxt_;

        /* free the image-allocated data associated with the page */
        fp_->free_mem(static_head_->data_);

        /* delete this one */
        delete static_head_;

        /* move on to the next */
        static_head_ = nxt;
    }
}